

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O0

int nes_pack_8x8_tile(uchar *buffer,void *data,int line_offset,int format)

{
  byte bVar1;
  byte local_64;
  byte local_60;
  byte local_5c;
  byte local_58;
  uint *packed;
  uchar *ptr;
  int local_38;
  uint pixel;
  int err;
  int cnt;
  int j;
  int i;
  int format_local;
  int line_offset_local;
  void *data_local;
  uchar *buffer_local;
  
  if (pass == 1) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    if (format == 1) {
      pixel = 0;
      packed = (uint *)data;
      for (cnt = 0; cnt < 8; cnt = cnt + 1) {
        for (err = 0; err < 8; err = err + 1) {
          bVar1 = *(byte *)((long)packed + (long)(int)(err ^ 7));
          if ((bVar1 & 1) == 0) {
            local_58 = 0;
          }
          else {
            local_58 = (byte)(1 << ((byte)err & 0x1f));
          }
          buffer[(int)pixel] = buffer[(int)pixel] | local_58;
          if ((bVar1 & 2) == 0) {
            local_5c = 0;
          }
          else {
            local_5c = (byte)(1 << ((byte)err & 0x1f));
          }
          buffer[(int)(pixel + 8)] = buffer[(int)(pixel + 8)] | local_5c;
        }
        packed = (uint *)((long)packed + (long)line_offset);
        pixel = pixel + 1;
      }
    }
    else if (format == 2) {
      pixel = 0;
      local_38 = 0;
      for (cnt = 0; cnt < 8; cnt = cnt + 1) {
        ptr._4_4_ = *(uint *)((long)data + (long)cnt * 4);
        for (err = 0; err < 8; err = err + 1) {
          if ((ptr._4_4_ & 0xc) != 0) {
            local_38 = local_38 + 1;
          }
          if ((ptr._4_4_ & 1) == 0) {
            local_60 = 0;
          }
          else {
            local_60 = (byte)(1 << ((byte)err & 0x1f));
          }
          buffer[(int)pixel] = buffer[(int)pixel] | local_60;
          if ((ptr._4_4_ & 2) == 0) {
            local_64 = 0;
          }
          else {
            local_64 = (byte)(1 << ((byte)err & 0x1f));
          }
          buffer[(int)(pixel + 8)] = buffer[(int)(pixel + 8)] | local_64;
          ptr._4_4_ = ptr._4_4_ >> 4;
        }
        pixel = pixel + 1;
      }
      if (local_38 != 0) {
        error("Incorrect pixel color index!");
      }
    }
    else {
      error("Internal error: unsupported format passed to \'pack_8x8_tile\'!");
    }
  }
  return 0x10;
}

Assistant:

int
nes_pack_8x8_tile(unsigned char *buffer, void *data, int line_offset, int format)
{
	int i, j;
	int cnt, err;
	unsigned int   pixel;
	unsigned char *ptr;
	unsigned int  *packed;

	/* pack the tile only in the last pass */
	if (pass != LAST_PASS)
		return (16);

	/* clear buffer */
	memset(buffer, 0, 16);

	/* encode the tile */
	switch (format) {
	case CHUNKY_TILE:
		/* 8-bit chunky format */
		cnt = 0;
		ptr = data;

		for (i = 0; i < 8; i++) {
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x07];
				buffer[cnt]   |= (pixel & 0x01) ? (1 << j) : 0;
				buffer[cnt+8] |= (pixel & 0x02) ? (1 << j) : 0;
			}				
			ptr += line_offset;
			cnt += 1;
		}
		break;

	case PACKED_TILE:
		/* 4-bit packed format */
		cnt = 0;
		err = 0;
		packed = data;
	
		for (i = 0; i < 8; i++) {
			pixel = packed[i];
	
			for (j = 0; j < 8; j++) {
				/* check for errors */
				if (pixel & 0x0C)
					err++;

				/* convert the tile */
				buffer[cnt]   |= (pixel & 0x01) ? (1 << j) : 0;
				buffer[cnt+8] |= (pixel & 0x02) ? (1 << j) : 0;
				pixel >>= 4;
			}
			cnt += 1;
		}

		/* error message */
		if (err)
			error("Incorrect pixel color index!");
		break;

	default:
		/* other formats not supported */
		error("Internal error: unsupported format passed to 'pack_8x8_tile'!");
		break;
	}

	/* ok */
	return (16);
}